

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::execAddRgEa<(moira::Instr)118,(moira::Mode)3,(moira::Size)4>(Moira *this,u16 opcode)

{
  uint uVar1;
  bool bVar2;
  u32 uVar3;
  uint uVar4;
  ulong uVar5;
  u32 data;
  u32 ea;
  uint local_20;
  u32 local_1c;
  
  bVar2 = readOp<(moira::Mode)3,(moira::Size)4,0ul>(this,opcode & 7,&local_1c,&local_20);
  if (bVar2) {
    uVar1 = *(uint *)((long)this->exec + (ulong)(opcode >> 9 & 7) * 4 + -0x58);
    uVar5 = (ulong)local_20 - (ulong)uVar1;
    bVar2 = (bool)((byte)(uVar5 >> 0x20) & 1);
    (this->reg).sr.c = bVar2;
    (this->reg).sr.x = bVar2;
    uVar4 = (uint)uVar5;
    (this->reg).sr.v = (int)((uVar4 ^ local_20) & (uVar1 ^ local_20)) < 0;
    (this->reg).sr.z = uVar4 == 0;
    (this->reg).sr.n = (bool)((byte)(uVar5 >> 0x1f) & 1);
    uVar3 = (this->reg).pc;
    (this->reg).pc0 = uVar3;
    (this->queue).ird = (this->queue).irc;
    uVar3 = readM<(moira::MemSpace)2,(moira::Size)2,0ul>(this,uVar3 + 2);
    (this->queue).irc = (u16)uVar3;
    writeM<(moira::MemSpace)1,(moira::Size)2,0ul>(this,local_1c,(uint)(uVar5 >> 0x10) & 0xffff);
    writeM<(moira::MemSpace)1,(moira::Size)2,4ul>(this,local_1c + 2,uVar4 & 0xffff);
  }
  return;
}

Assistant:

void
Moira::execAddRgEa(u16 opcode)
{
    u32 ea, data, result;

    int src = ____xxx_________(opcode);
    int dst = _____________xxx(opcode);

    if (!readOp<M,S, STD_AE_FRAME>(dst, ea, data)) return;
    result = addsub<I,S>(readD<S>(src), data);

    prefetch();
    writeM <M, S, POLLIPL> (ea, result);
}